

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

string * getTime_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  time_t rawtime;
  char buffer [80];
  time_t local_70;
  char local_68 [88];
  
  time(&local_70);
  __tp = localtime(&local_70);
  strftime(local_68,0x50,"%d-%m-%Y %I:%M:%S",__tp);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_68);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

String getTime(){
    time_t rawtime;
    struct tm * timeinfo;
    char buffer[80];

    time (&rawtime);
    timeinfo = localtime(&rawtime);

    strftime(buffer,sizeof(buffer),"%d-%m-%Y %I:%M:%S",timeinfo);
    return String(buffer);
}